

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotShaded<int>
               (char *label_id,int *xs,int *ys,int count,double y_ref,int offset,int stride)

{
  undefined1 local_78 [8];
  GetterXsYRef<int> getter2;
  GetterXsYs<int> getter1;
  int stride_local;
  int offset_local;
  double y_ref_local;
  int count_local;
  int *ys_local;
  int *xs_local;
  char *label_id_local;
  
  GetterXsYs<int>::GetterXsYs((GetterXsYs<int> *)&getter2.Stride,xs,ys,count,offset,stride);
  GetterXsYRef<int>::GetterXsYRef((GetterXsYRef<int> *)local_78,xs,y_ref,count,offset,stride);
  PlotShadedEx<ImPlot::GetterXsYs<int>,ImPlot::GetterXsYRef<int>>
            (label_id,(GetterXsYs<int> *)&getter2.Stride,(GetterXsYRef<int> *)local_78);
  return;
}

Assistant:

void PlotShaded(const char* label_id, const T* xs, const T* ys, int count, double y_ref, int offset, int stride) {
    GetterXsYs<T> getter1(xs, ys, count, offset, stride);
    GetterXsYRef<T> getter2(xs, y_ref, count, offset, stride);
    PlotShadedEx(label_id, getter1, getter2);
}